

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

ByteData256 *
cfd::CollectSighashByTx
          (ByteData256 *__return_storage_ptr__,Transaction *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion witness_version,ByteData *param_8,TaprootScriptTree *param_9)

{
  bool bVar1;
  uint32_t uVar2;
  Script local_b0;
  SigHashType local_74;
  Script local_68;
  
  core::OutPoint::GetTxid((Txid *)&local_b0,outpoint);
  uVar2 = core::OutPoint::GetVout(outpoint);
  uVar2 = (*(transaction->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                    (transaction,&local_b0,(ulong)uVar2);
  local_b0._vptr_Script = (_func_int **)&PTR__Txid_00735400;
  if (local_b0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::Script(&local_b0,redeem_script);
  bVar1 = core::Script::IsEmpty(&local_b0);
  if (bVar1) {
    core::ScriptUtil::CreateP2pkhLockingScript(&local_68,pubkey);
    core::Script::operator=(&local_b0,&local_68);
    core::Script::~Script(&local_68);
  }
  core::Script::GetData((ByteData *)&local_68,&local_b0);
  core::SigHashType::SigHashType(&local_74,sighash_type);
  core::Transaction::GetSignatureHash
            (__return_storage_ptr__,transaction,uVar2,(ByteData *)&local_68,&local_74,&utxo->amount,
             witness_version);
  if (local_68._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_68._vptr_Script);
  }
  core::Script::~Script(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}